

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel *self,int new_size,ImDrawChannel *v)

{
  ImDrawChannel *v_local;
  int new_size_local;
  ImVector_ImDrawChannel *self_local;
  
  ImVector<ImDrawChannel>::resize(self,new_size,v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel* self,int new_size,const ImDrawChannel v)
{
    return self->resize(new_size,v);
}